

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_frommesh.cpp
# Opt level: O2

void __thiscall ON_NgonBoundaryChecker::Internal_Reset(ON_NgonBoundaryChecker *this)

{
  uint i;
  long lVar1;
  
  ON_FixedSizePool::ReturnAll(&this->m_fsp);
  for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
    this->m_hash_table[lVar1] = (ON_NgonBoundaryComponent *)0x0;
  }
  this->m_bIsSimple = false;
  this->m_bIsNotSimple = false;
  this->m_vertex_count = 0;
  this->m_edge_count = 0;
  return;
}

Assistant:

void ON_NgonBoundaryChecker::Internal_Reset()
{
  m_fsp.ReturnAll();
  for (unsigned i = 0; i < ON_NgonBoundaryChecker::HashTableSize; ++i)
    m_hash_table[i] = nullptr;
  m_vertex_count = 0;
  m_edge_count = 0;
  m_bIsSimple = false;
  m_bIsNotSimple = false;
}